

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_term_compute.cpp
# Opt level: O2

void __thiscall SourceTermCompute::upward_pass(SourceTermCompute *this)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Molecule *pMVar5;
  InterpolationPoints *pIVar6;
  pointer pdVar7;
  pointer pdVar8;
  Tree *this_00;
  int iVar9;
  ulong uVar10;
  unsigned_long uVar11;
  ulong uVar12;
  size_type __n;
  size_t i_2;
  size_type sVar13;
  int k3;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  array<unsigned_long,_2UL> aVar25;
  vector<int,_std::allocator<int>_> exact_idx_z;
  vector<int,_std::allocator<int>_> exact_idx_x;
  vector<double,_std::allocator<double>_> denominator;
  vector<int,_std::allocator<int>_> exact_idx_y;
  vector<double,_std::allocator<double>_> weights;
  allocator_type local_179;
  ulong local_178;
  pointer local_170;
  int local_164;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  ulong local_148;
  pointer local_140;
  pointer local_138;
  pointer local_130;
  pointer local_128;
  ulong local_120;
  ulong local_118;
  long local_110;
  pointer local_108;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  long local_e8;
  SourceTermCompute *local_e0;
  pointer local_d8;
  pointer local_d0;
  pointer local_c8;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_90;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_178 = (ulong)this->num_mol_interp_pts_per_node_;
  local_e8 = (long)this->num_mol_interp_charges_per_node_;
  pMVar5 = this->molecule_;
  pIVar6 = this->mol_interp_pts_;
  local_140 = (pMVar5->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pdVar7 = (pMVar5->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (pMVar5->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_100 = (pMVar5->charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_150 = (pIVar6->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_158 = (pIVar6->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_160 = (pIVar6->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_108 = (this->mol_interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start;
  local_e0 = this;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,local_178,
             (allocator_type *)&local_90);
  local_170 = local_48._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar9 = (int)uVar10;
  uVar12 = 0;
  uVar10 = uVar10 & 0xffffffff;
  if (iVar9 < 1) {
    uVar10 = uVar12;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    dVar18 = *(double *)(&DAT_00115860 + (ulong)((uVar12 & 1) == 0) * 8) * 0.5;
    dVar24 = dVar18;
    if (iVar9 - 1 != uVar12) {
      dVar24 = *(double *)(&DAT_00115860 + (ulong)((uVar12 & 1) == 0) * 8);
    }
    if (uVar12 != 0) {
      dVar18 = dVar24;
    }
    local_48._M_impl.super__Vector_impl_data._M_start[uVar12] = dVar18;
  }
  iVar9 = (int)local_178;
  local_164 = iVar9 * iVar9;
  uVar10 = 0;
  local_120 = 0;
  if (0 < iVar9) {
    local_120 = local_178 & 0xffffffff;
  }
  local_118 = local_178 & 0xffffffff;
  local_110 = local_178 * 8;
  local_128 = local_150;
  local_130 = local_158;
  local_138 = local_160;
  local_f8 = pdVar8;
  local_f0 = pdVar7;
  while( true ) {
    pdVar8 = local_f0;
    pdVar7 = local_f8;
    this_00 = (local_e0->super_TreeCompute).source_tree_;
    if (this_00->num_nodes_ <= uVar10) break;
    local_148 = uVar10;
    aVar25 = Tree::node_particle_idxs(this_00,uVar10);
    uVar11 = aVar25._M_elems[0];
    __n = aVar25._M_elems[1] - uVar11;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_90,__n,(allocator_type *)&local_60);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_60,__n,(allocator_type *)&local_a8);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_a8,__n,(allocator_type *)&local_78);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_78,__n,&local_179);
    lVar14 = local_148 * local_178;
    for (sVar13 = 0; __n != sVar13; sVar13 = sVar13 + 1) {
      local_90._M_impl.super__Vector_impl_data._M_start[sVar13] = -1;
      local_60._M_impl.super__Vector_impl_data._M_start[sVar13] = -1;
      local_a8._M_impl.super__Vector_impl_data._M_start[sVar13] = -1;
    }
    for (sVar13 = 0; sVar13 != __n; sVar13 = sVar13 + 1) {
      lVar1 = sVar13 + uVar11;
      dVar18 = pdVar7[lVar1];
      dVar24 = pdVar8[lVar1];
      dVar2 = local_140[lVar1];
      dVar16 = 0.0;
      dVar17 = 0.0;
      dVar19 = 0.0;
      for (uVar10 = 0; local_120 != uVar10; uVar10 = uVar10 + 1) {
        dVar3 = local_128[uVar10];
        dVar4 = local_170[uVar10];
        dVar22 = local_138[uVar10];
        dVar23 = local_130[uVar10];
        iVar9 = (int)uVar10;
        if (ABS(dVar2 - dVar3) < 2.2250738585072014e-308) {
          local_90._M_impl.super__Vector_impl_data._M_start[sVar13] = iVar9;
        }
        dVar22 = dVar18 - dVar22;
        dVar23 = dVar24 - dVar23;
        if (ABS(dVar23) < 2.2250738585072014e-308) {
          local_60._M_impl.super__Vector_impl_data._M_start[sVar13] = iVar9;
        }
        if (ABS(dVar22) < 2.2250738585072014e-308) {
          local_a8._M_impl.super__Vector_impl_data._M_start[sVar13] = iVar9;
        }
        dVar19 = dVar19 + dVar4 / (dVar2 - dVar3);
        auVar20._8_8_ = dVar4;
        auVar20._0_8_ = dVar4;
        auVar21._8_8_ = dVar23;
        auVar21._0_8_ = dVar22;
        auVar21 = divpd(auVar20,auVar21);
        dVar16 = dVar16 + auVar21._0_8_;
        dVar17 = dVar17 + auVar21._8_8_;
      }
      local_78._M_impl.super__Vector_impl_data._M_start[sVar13] = 1.0;
      dVar18 = 1.0;
      if (local_90._M_impl.super__Vector_impl_data._M_start[sVar13] == -1) {
        dVar18 = 1.0 / dVar19;
        local_78._M_impl.super__Vector_impl_data._M_start[sVar13] = dVar18;
      }
      if (local_60._M_impl.super__Vector_impl_data._M_start[sVar13] == -1) {
        dVar18 = dVar18 / dVar17;
        local_78._M_impl.super__Vector_impl_data._M_start[sVar13] = dVar18;
      }
      if (local_a8._M_impl.super__Vector_impl_data._M_start[sVar13] == -1) {
        local_78._M_impl.super__Vector_impl_data._M_start[sVar13] = dVar18 / dVar16;
      }
    }
    local_b8 = local_150 + lVar14;
    local_c0 = local_158 + lVar14;
    local_c8 = local_160 + lVar14;
    local_d8 = local_108 + local_148 * local_e8;
    for (uVar10 = 0; uVar10 != local_120; uVar10 = uVar10 + 1) {
      local_d0 = local_d8 + local_164 * (int)uVar10;
      for (uVar12 = 0; uVar12 != local_118; uVar12 = uVar12 + 1) {
        local_b0 = local_d0 + uVar12 * local_178;
        for (uVar15 = 0; uVar15 != local_118; uVar15 = uVar15 + 1) {
          dVar18 = 0.0;
          for (sVar13 = 0; __n != sVar13; sVar13 = sVar13 + 1) {
            if ((ulong)(uint)local_90._M_impl.super__Vector_impl_data._M_start[sVar13] == 0xffffffff
               ) {
              dVar24 = local_170[uVar10] / (local_140[uVar11 + sVar13] - local_b8[uVar10]);
            }
            else {
              dVar24 = 1.0;
              if (uVar10 != (uint)local_90._M_impl.super__Vector_impl_data._M_start[sVar13]) {
                dVar24 = 0.0;
              }
            }
            if ((ulong)(uint)local_60._M_impl.super__Vector_impl_data._M_start[sVar13] == 0xffffffff
               ) {
              dVar24 = dVar24 * (local_170[uVar12] / (pdVar8[uVar11 + sVar13] - local_c0[uVar12]));
            }
            else if (uVar12 != (uint)local_60._M_impl.super__Vector_impl_data._M_start[sVar13]) {
              dVar24 = dVar24 * 0.0;
            }
            if ((ulong)(uint)local_a8._M_impl.super__Vector_impl_data._M_start[sVar13] == 0xffffffff
               ) {
              dVar24 = dVar24 * (local_170[uVar15] / (pdVar7[uVar11 + sVar13] - local_c8[uVar15]));
            }
            else if (uVar15 != (uint)local_a8._M_impl.super__Vector_impl_data._M_start[sVar13]) {
              dVar24 = dVar24 * 0.0;
            }
            dVar18 = dVar18 + dVar24 * local_100[uVar11 + sVar13] *
                              local_78._M_impl.super__Vector_impl_data._M_start[sVar13];
          }
          local_b0[uVar15] = dVar18 + local_b0[uVar15];
        }
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
    uVar10 = local_148 + 1;
    local_138 = (pointer)((long)local_138 + local_110);
    local_130 = (pointer)((long)local_130 + local_110);
    local_128 = (pointer)((long)local_128 + local_110);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void SourceTermCompute::upward_pass()
{
//    timers_.upward_pass.start();

    int num_mol_interp_pts_per_node     = num_mol_interp_pts_per_node_;
    int num_mol_interp_charges_per_node = num_mol_interp_charges_per_node_;
    
    const double* __restrict mol_x_ptr = molecule_.x_ptr();
    const double* __restrict mol_y_ptr = molecule_.y_ptr();
    const double* __restrict mol_z_ptr = molecule_.z_ptr();
    
    const double* __restrict mol_q_ptr = molecule_.charge_ptr();
    
    const double* __restrict mol_clusters_x_ptr = mol_interp_pts_.interp_x_ptr();
    const double* __restrict mol_clusters_y_ptr = mol_interp_pts_.interp_y_ptr();
    const double* __restrict mol_clusters_z_ptr = mol_interp_pts_.interp_z_ptr();
    
    double*       __restrict mol_clusters_q_ptr = mol_interp_charge_.data();
    
        
    std::vector<double> weights (num_mol_interp_pts_per_node);
    double* weights_ptr = weights.data();
    int weights_num = weights.size();
    
    for (int i = 0; i < weights_num; ++i) {
        weights[i] = ((i % 2 == 0)? 1 : -1);
        if (i == 0 || i == weights_num-1) weights[i] = ((i % 2 == 0)? 1 : -1) * 0.5;
    }

    
#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(weights_ptr[0:weights_num])
#endif
    
    for (std::size_t node_idx = 0; node_idx < source_tree_.num_nodes(); ++node_idx) {
        
        auto particle_idxs = source_tree_.node_particle_idxs(node_idx);
        
        std::size_t node_interp_pts_start = node_idx * num_mol_interp_pts_per_node;
        std::size_t node_charges_start    = node_idx * num_mol_interp_charges_per_node;
        
        std::size_t particle_start = particle_idxs[0];
        std::size_t num_particles  = particle_idxs[1] - particle_idxs[0];
        
        std::vector<int> exact_idx_x(num_particles);
        std::vector<int> exact_idx_y(num_particles);
        std::vector<int> exact_idx_z(num_particles);
        std::vector<double> denominator(num_particles);
        
        int* exact_idx_x_ptr = exact_idx_x.data();
        int* exact_idx_y_ptr = exact_idx_y.data();
        int* exact_idx_z_ptr = exact_idx_z.data();
        double* denominator_ptr = denominator.data();
        
#ifdef OPENACC_ENABLED
#pragma acc kernels present(mol_x_ptr, mol_y_ptr, mol_z_ptr, mol_q_ptr, \
                            mol_clusters_x_ptr, mol_clusters_y_ptr, mol_clusters_z_ptr, \
                            mol_clusters_q_ptr, weights_ptr) \
                  create(exact_idx_x_ptr[0:num_particles], exact_idx_y_ptr[0:num_particles], \
                         exact_idx_z_ptr[0:num_particles], denominator_ptr[0:num_particles])
#endif
        {

#ifdef OPENACC_ENABLED
        #pragma acc loop vector(32) independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
            exact_idx_x_ptr[i] = -1;
            exact_idx_y_ptr[i] = -1;
            exact_idx_z_ptr[i] = -1;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
        
            double denominator_x = 0.;
            double denominator_y = 0.;
            double denominator_z = 0.;
            
            double xx = mol_x_ptr[particle_start + i];
            double yy = mol_y_ptr[particle_start + i];
            double zz = mol_z_ptr[particle_start + i];

            // because there's a reduction over exact_idx[i], this loop carries a
            // backward dependence and won't actually parallelize
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:denominator_x,denominator_y,denominator_z)
#endif
            for (int j = 0; j < num_mol_interp_pts_per_node; ++j) {
            
                double dist_x = xx - mol_clusters_x_ptr[node_interp_pts_start + j];
                double dist_y = yy - mol_clusters_y_ptr[node_interp_pts_start + j];
                double dist_z = zz - mol_clusters_z_ptr[node_interp_pts_start + j];
                
                denominator_x += weights_ptr[j] / dist_x;
                denominator_y += weights_ptr[j] / dist_y;
                denominator_z += weights_ptr[j] / dist_z;
                
                if (std::abs(dist_x) < std::numeric_limits<double>::min()) exact_idx_x_ptr[i] = j;
                if (std::abs(dist_y) < std::numeric_limits<double>::min()) exact_idx_y_ptr[i] = j;
                if (std::abs(dist_z) < std::numeric_limits<double>::min()) exact_idx_z_ptr[i] = j;
            }
            
            denominator_ptr[i] = 1.0;
            if (exact_idx_x_ptr[i] == -1) denominator_ptr[i] /= denominator_x;
            if (exact_idx_y_ptr[i] == -1) denominator_ptr[i] /= denominator_y;
            if (exact_idx_z_ptr[i] == -1) denominator_ptr[i] /= denominator_z;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) independent
#endif
        for (int k1 = 0; k1 < num_mol_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_mol_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_mol_interp_pts_per_node; ++k3) {
        
            std::size_t kk = node_charges_start
                   + k1 * num_mol_interp_pts_per_node * num_mol_interp_pts_per_node
                   + k2 * num_mol_interp_pts_per_node + k3;
                   
            double cx = mol_clusters_x_ptr[node_interp_pts_start + k1];
            double w1 = weights_ptr[k1];

            double cy = mol_clusters_y_ptr[node_interp_pts_start + k2];
            double w2 = weights_ptr[k2];
            
            double cz = mol_clusters_z_ptr[node_interp_pts_start + k3];
            double w3 = weights_ptr[k3];
            
            double q_temp = 0.;
            
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:q_temp)
#endif
            for (std::size_t i = 0; i < num_particles; i++) {  // loop over source points
            
                double dist_x = mol_x_ptr[particle_start + i] - cx;
                double dist_y = mol_y_ptr[particle_start + i] - cy;
                double dist_z = mol_z_ptr[particle_start + i] - cz;
                
                double numerator = 1.;

                // If exact_idx[i] == -1, then no issues.
                // If exact_idx[i] != -1, then we want to zero out terms EXCEPT when exactInd=k1.
                if (exact_idx_x_ptr[i] == -1) {
                    numerator *= w1 / dist_x;
                } else {
                    if (exact_idx_x_ptr[i] != k1) numerator *= 0.;
                }

                if (exact_idx_y_ptr[i] == -1) {
                    numerator *= w2 / dist_y;
                } else {
                    if (exact_idx_y_ptr[i] != k2) numerator *= 0.;
                }

                if (exact_idx_z_ptr[i] == -1) {
                    numerator *= w3 / dist_z;
                } else {
                    if (exact_idx_z_ptr[i] != k3) numerator *= 0.;
                }

                q_temp += mol_q_ptr[particle_start + i] * numerator * denominator_ptr[i];
            }
            
            mol_clusters_q_ptr[kk] += q_temp;
        }
        }
        }
        
        } // end parallel region
    } // end loop over nodes
#ifdef OPENACC_ENABLED
    #pragma acc exit data delete(weights_ptr[0:weights_num])
#endif

//    timers_.upward_pass.stop();
}